

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
HecrSequential_cyclicReductionIdentityMatrix_Test::
~HecrSequential_cyclicReductionIdentityMatrix_Test
          (HecrSequential_cyclicReductionIdentityMatrix_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HecrSequential, cyclicReductionIdentityMatrix)
{
    int size = 15;
    vec diag(size, 1.0);
    vec subdiag(size, 0.0);
    TridiagonalMatrix m(diag, subdiag, subdiag);
    const double rhs_values[] = { 1.0, 2.0, -0.5, 0.4, 33.3, -11.0, 2.3, 4.4,
        -15.7, -5.8, -6.58, 0.11, 4.04, 5.02, 8.0 };
    vec rhs = make_vector(size, rhs_values);

    vec solution = cyclic_reduction(m, rhs);

    EXPECT_LT(max_diff(rhs, solution), EPS);
}